

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_canbus.cc
# Opt level: O2

int __thiscall ccel::canbus::canbus_handler::open(canbus_handler *this,char *__file,int __oflag,...)

{
  logic_error *this_00;
  native_handle_type __tmp_sock_holder;
  error_code __tmp_ec_holder;
  
  __tmp_sock_holder = open_cansock(__file,1);
  __tmp_ec_holder.m_val = 0;
  __tmp_ec_holder.m_cat = boost::system::system_category();
  boost::asio::posix::descriptor::assign
            (&(this->_stream).super_descriptor,&__tmp_sock_holder,&__tmp_ec_holder);
  if (__tmp_ec_holder.m_val == 0) {
    (this->super_base_handler)._open = true;
    std::__cxx11::string::assign((char *)&this->_interface_name);
    return 0;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"[CANBUS_Handler]boost_basic_stream assign error happend.");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int canbus_handler::open(const char *interface_name) {
  try {
    auto __tmp_sock_holder = open_cansock(interface_name);
    boost::system::error_code __tmp_ec_holder;
    _stream.assign(__tmp_sock_holder, __tmp_ec_holder);
    if (__tmp_ec_holder)
      throw std::logic_error(
          "[CANBUS_Handler]boost_basic_stream assign error happend.");
    _open = true;
    _interface_name = interface_name;
    return 0;
  } catch (std::runtime_error &_e) {
    return -1;
  } catch (...) {
    throw;
  }
}